

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O3

int cpu_ldsw_data_ra_x86_64(CPUArchState *env,target_ulong ptr,uintptr_t retaddr)

{
  uint64_t uVar1;
  TCGMemOpIdx oi;
  
  oi = 0x11;
  if (((~env->hflags & 3) != 0) && (oi = 0x12, (env->hflags >> 0x17 & 1) != 0)) {
    oi = (uint)env->eflags >> 0x11 & 2 | 0x10;
  }
  uVar1 = load_helper(env,ptr,oi,retaddr,MO_16,false,full_le_lduw_mmu);
  return (int)(short)uVar1;
}

Assistant:

int cpu_ldsw_data_ra(CPUArchState *env, target_ulong ptr, uintptr_t retaddr)
{
    return cpu_ldsw_mmuidx_ra(env, ptr, cpu_mmu_index(env, false), retaddr);
}